

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BehaviourTree.h
# Opt level: O1

void __thiscall BehaviourTree::DecoratorNode::~DecoratorNode(DecoratorNode *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~DecoratorNode() {
            if (child != nullptr) {
                //delete child;
                child = nullptr;
            }
        }